

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cc
# Opt level: O1

string * leveldb::DescriptorFileName(string *__return_storage_ptr__,string *dbname,uint64_t number)

{
  pointer pcVar1;
  char buf [100];
  char acStack_88 [104];
  
  if (number != 0) {
    snprintf(acStack_88,100,"/MANIFEST-%06llu",number);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (dbname->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + dbname->_M_string_length);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  __assert_fail("number > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/filename.cc"
                ,0x2c,"std::string leveldb::DescriptorFileName(const std::string &, uint64_t)");
}

Assistant:

std::string DescriptorFileName(const std::string& dbname, uint64_t number) {
  assert(number > 0);
  char buf[100];
  snprintf(buf, sizeof(buf), "/MANIFEST-%06llu",
           static_cast<unsigned long long>(number));
  return dbname + buf;
}